

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreFilter.hpp
# Opt level: O3

void __thiscall
cppjieba::PreFilter::PreFilter
          (PreFilter *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *symbols,string *sentence)

{
  bool bVar1;
  long lVar2;
  Logger LStack_198;
  
  lVar2 = 0x10;
  do {
    *(undefined8 *)((long)(this->sentence_).buffer_ + lVar2 + -0x10) = 0;
    *(undefined4 *)((long)(this->sentence_).buffer_ + lVar2 + -8) = 0;
    lVar2 = lVar2 + 0x14;
  } while (lVar2 != 0x150);
  (this->sentence_).ptr_ = (this->sentence_).buffer_;
  (this->sentence_).size_ = 0;
  (this->sentence_).capacity_ = 0x10;
  this->symbols_ = symbols;
  bVar1 = DecodeRunesInString((sentence->_M_dataplus)._M_p,sentence->_M_string_length,
                              &this->sentence_);
  if (!bVar1) {
    limonp::Logger::Logger
              (&LStack_198,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/PreFilter.hpp"
               ,0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&LStack_198,"decode failed. ",0xf)
    ;
    limonp::Logger::~Logger(&LStack_198);
  }
  this->cursor_ = (this->sentence_).ptr_;
  return;
}

Assistant:

PreFilter(const unordered_set<Rune>& symbols, 
        const string& sentence)
    : symbols_(symbols) {
    if (!DecodeRunesInString(sentence, sentence_)) {
      XLOG(ERROR) << "decode failed. "; 
    }
    cursor_ = sentence_.begin();
  }